

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::LinearConstraint::LinearConstraint
          (LinearConstraint *this,size_t size,string *name)

{
  LinearConstraintImplementation *this_00;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)name);
  Constraint::Constraint(&this->super_Constraint,size,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_Constraint)._vptr_Constraint = (_func_int **)&PTR__LinearConstraint_001d41d8;
  this_00 = (LinearConstraintImplementation *)operator_new(0x140);
  LinearConstraintImplementation::LinearConstraintImplementation(this_00,size);
  this->m_pimpl = this_00;
  return;
}

Assistant:

LinearConstraint::LinearConstraint(size_t size, const std::string name)
        : Constraint(size, name)
        , m_pimpl(new LinearConstraintImplementation(size))
        { }